

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portfwd.c
# Opt level: O3

void free_portfwd_state(PortForwarding *pf)

{
  if (pf != (PortForwarding *)0x0) {
    safefree(pf->hostname);
    if (pf->socksbuf != (strbuf *)0x0) {
      strbuf_free(pf->socksbuf);
    }
    safefree(pf);
    return;
  }
  return;
}

Assistant:

static void free_portfwd_state(struct PortForwarding *pf)
{
    if (!pf)
        return;
    sfree(pf->hostname);
    if (pf->socksbuf)
        strbuf_free(pf->socksbuf);
    sfree(pf);
}